

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseJacocoCoverage.cxx
# Opt level: O0

void __thiscall
cmParseJacocoCoverage::XMLParser::XMLParser
          (XMLParser *this,cmCTest *ctest,cmCTestCoverageHandlerContainer *cont)

{
  cmCTestCoverageHandlerContainer *cont_local;
  cmCTest *ctest_local;
  XMLParser *this_local;
  
  cmXMLParser::cmXMLParser(&this->super_cmXMLParser);
  (this->super_cmXMLParser)._vptr_cmXMLParser = (_func_int **)&PTR__XMLParser_00c156b0;
  std::__cxx11::string::string((string *)&this->PackageName);
  std::__cxx11::string::string((string *)&this->FileName);
  std::__cxx11::string::string((string *)&this->ModuleName);
  std::__cxx11::string::string((string *)&this->CurFileName);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->FilePaths);
  this->CTest = ctest;
  this->Coverage = cont;
  std::__cxx11::string::operator=((string *)&this->PackageName,"");
  std::__cxx11::string::operator=((string *)&this->ModuleName,"");
  std::__cxx11::string::operator=((string *)&this->FileName,"");
  std::__cxx11::string::operator=((string *)&this->CurFileName,"");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->FilePaths,&this->Coverage->SourceDir);
  return;
}

Assistant:

XMLParser(cmCTest* ctest, cmCTestCoverageHandlerContainer& cont)
      : CTest(ctest), Coverage(cont)
      {
      this->PackageName = "";
      this->ModuleName = "";
      this->FileName = "";
      this->CurFileName = "";
      this->FilePaths.push_back(this->Coverage.SourceDir);
      }